

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O0

void Sfm_ComputeInterpolantCheck(Sfm_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  word local_28;
  word uTruth;
  int local_18;
  int iDiv1;
  int iDiv0;
  int iNode;
  Sfm_Ntk_t *p_local;
  
  iDiv1 = 3;
  local_18 = 6;
  uTruth._4_4_ = 7;
  _iDiv0 = p;
  Sfm_NtkCreateWindow(p,3,1);
  Sfm_NtkWindowToSolver(_iDiv0);
  Vec_IntClear(_iDiv0->vDivIds);
  pVVar1 = _iDiv0->vDivIds;
  iVar2 = Sfm_ObjSatVar(_iDiv0,local_18);
  Vec_IntPush(pVVar1,iVar2);
  pVVar1 = _iDiv0->vDivIds;
  iVar2 = Sfm_ObjSatVar(_iDiv0,uTruth._4_4_);
  Vec_IntPush(pVVar1,iVar2);
  local_28 = Sfm_ComputeInterpolant(_iDiv0);
  if (local_28 == 0x8765432187654321) {
    printf("The problem is SAT.\n");
  }
  else if (local_28 == 0x1234567812345678) {
    printf("The problem is UNDEC.\n");
  }
  else {
    Kit_DsdPrintFromTruth((uint *)&local_28,2);
    printf("\n");
  }
  return;
}

Assistant:

void Sfm_ComputeInterpolantCheck( Sfm_Ntk_t * p )
{
    int iNode = 3;
    int iDiv0 = 6;
    int iDiv1 = 7;
    word uTruth;
//    int i;
//    Sfm_NtkForEachNode( p, i )
    {
        Sfm_NtkCreateWindow( p, iNode, 1 );
        Sfm_NtkWindowToSolver( p );

        // collect SAT variables of divisors
        Vec_IntClear( p->vDivIds );
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iDiv0) );
        Vec_IntPush( p->vDivIds, Sfm_ObjSatVar(p, iDiv1) );

        uTruth = Sfm_ComputeInterpolant( p );

        if ( uTruth == SFM_SAT_SAT )
            printf( "The problem is SAT.\n" );
        else if ( uTruth == SFM_SAT_UNDEC )
            printf( "The problem is UNDEC.\n" );
        else
            Kit_DsdPrintFromTruth( (unsigned *)&uTruth, 2 ), printf( "\n" );
    }
}